

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall YAML::Emitter::BlockMapPrepareSimpleKey(Emitter *this,value child)

{
  bool bVar1;
  pointer pEVar2;
  size_t sVar3;
  int in_ESI;
  size_t childCount;
  size_t curIndent;
  char (*in_stack_ffffffffffffffc8) [2];
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 requireSpace;
  undefined4 in_stack_fffffffffffffff0;
  
  pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
                     ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                      0xef8c2c);
  sVar3 = EmitterState::CurIndent(pEVar2);
  requireSpace = (undefined1)(sVar3 >> 0x38);
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef8c43);
  sVar3 = EmitterState::CurGroupChildCount
                    ((EmitterState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (in_ESI != 0) {
    pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
             operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                        0xef8c66);
    bVar1 = EmitterState::HasBegunNode(pEVar2);
    if ((!bVar1) && (sVar3 != 0)) {
      YAML::operator<<((ostream_wrapper *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
    }
    if ((in_ESI != 0) && ((in_ESI - 1U < 3 || ((in_ESI != 4 && (in_ESI == 5)))))) {
      pEVar2 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
               operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                           *)0xef8cd9);
      EmitterState::HasBegunContent(pEVar2);
      SpaceOrIndentTo((Emitter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(bool)requireSpace,sVar3
                     );
    }
  }
  return;
}

Assistant:

void Emitter::BlockMapPrepareSimpleKey(EmitterNodeType::value child) {
  const std::size_t curIndent = m_pState->CurIndent();
  const std::size_t childCount = m_pState->CurGroupChildCount();

  if (child == EmitterNodeType::NoType)
    return;

  if (!m_pState->HasBegunNode()) {
    if (childCount > 0) {
      m_stream << "\n";
    }
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(m_pState->HasBegunContent(), curIndent);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      break;
  }
}